

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O1

ArenaBlock * __thiscall
google::protobuf::internal::ThreadSafeArena::FirstBlock
          (ThreadSafeArena *this,void *buf,size_t size,AllocationPolicy *policy)

{
  pointer pcVar1;
  size_type sVar2;
  long lVar3;
  bool bVar4;
  ArenaBlock *pAVar5;
  ArenaBlock *pAVar6;
  string *psVar7;
  string *psVar8;
  size_t size_00;
  ulong uVar9;
  ulong uVar10;
  AllocationPolicy *pAVar11;
  ulong uVar12;
  SizedPtr SVar13;
  long *plStack_78;
  LogMessageFatal aLStack_70 [16];
  void *pvStack_60;
  size_t sStack_58;
  AllocationPolicy *pAStack_50;
  AllocationPolicy local_48;
  
  pAVar11 = &local_48;
  SVar13.n = size;
  SVar13.p = buf;
  if ((((policy->start_block_size == 0x100) && (policy->max_block_size == 0x8000)) &&
      (policy->block_alloc == (_func_void_ptr_size_t *)0x0)) &&
     (policy->block_dealloc == (_func_void_void_ptr_size_t *)0x0)) {
    pAVar5 = FirstBlock(this,buf,size);
    return pAVar5;
  }
  if (((ulong)buf & 7) == 0) {
    psVar7 = (string *)0x0;
  }
  else {
    pAStack_50 = (AllocationPolicy *)0x1c432e;
    psVar7 = absl::lts_20240722::log_internal::MakeCheckOpString<unsigned_long,long>
                       ((ulong)buf & 7,0,"reinterpret_cast<uintptr_t>(buf) & 7 == 0u");
  }
  if (psVar7 != (string *)0x0) {
    pAStack_50 = (AllocationPolicy *)InitializeWithPolicy;
    FirstBlock();
    pvStack_60 = buf;
    sStack_58 = size;
    pAStack_50 = policy;
    pAVar6 = (ArenaBlock *)__tls_get_addr(&PTR_004d49d0);
    pAVar5 = pAVar6->next;
    if ((char)pAVar5 == '\0') {
      LOCK();
      UNLOCK();
      pAVar5 = (ArenaBlock *)(lifecycle_id_ << 8);
      lifecycle_id_ = lifecycle_id_ + 1;
    }
    pAVar6->next = (ArenaBlock *)((long)&pAVar5->next + 1);
    *(ArenaBlock **)pAVar11 = pAVar5;
    *(undefined1 **)((long)pAVar11 + 0x20) = kSentryArenaChunk;
    *(ArenaBlock **)((long)pAVar11 + 0x28) = pAVar6;
    pAVar6[1].next = (ArenaBlock *)((long)pAVar11 + 0x30);
    pAVar6->size = pAVar11->start_block_size;
    if ((((psVar7->_M_dataplus)._M_p == (pointer)0x100) && (psVar7->_M_string_length == 0x8000)) &&
       (((psVar7->field_2)._M_allocated_capacity == 0 &&
        (*(long *)((long)&psVar7->field_2 + 8) == 0)))) {
      return pAVar6;
    }
    uVar10 = *(ulong *)((long)pAVar11 + 8);
    bVar4 = SerialArena::MaybeAllocateAligned
                      ((SerialArena *)((long)pAVar11 + 0x30),0x20,&plStack_78);
    if (bVar4) {
      pcVar1 = (psVar7->_M_dataplus)._M_p;
      sVar2 = psVar7->_M_string_length;
      lVar3 = *(long *)((long)&psVar7->field_2 + 8);
      plStack_78[2] = (psVar7->field_2)._M_allocated_capacity;
      plStack_78[3] = lVar3;
      *plStack_78 = (long)pcVar1;
      plStack_78[1] = sVar2;
      if (((ulong)plStack_78 & 3) == 0) {
        psVar7 = (string *)0x0;
      }
      else {
        psVar7 = absl::lts_20240722::log_internal::MakeCheckOpString<long,unsigned_long>
                           (0,(ulong)plStack_78 & 3,"0u == reinterpret_cast<uintptr_t>(p) & 3");
      }
      if (psVar7 == (string *)0x0) {
        uVar9 = (ulong)((uint)*(size_t *)((long)pAVar11 + 8) & 7) | (ulong)plStack_78;
        *(ulong *)((long)pAVar11 + 8) = uVar9;
        if (uVar10 < 4) {
          return (ArenaBlock *)0x0;
        }
        uVar12 = (ulong)((uint)uVar10 & 3);
        uVar10 = (ulong)((uint)uVar9 & 3);
        if (uVar12 == uVar10) {
          psVar8 = (string *)0x0;
        }
        else {
          psVar8 = absl::lts_20240722::log_internal::MakeCheckOpString<unsigned_long,unsigned_long>
                             (uVar12,uVar10,"old_alloc_policy & 3 == alloc_policy_.get_raw() & 3");
        }
        if (psVar8 == (string *)0x0) {
          return (ArenaBlock *)0x0;
        }
      }
      else {
        InitializeWithPolicy();
      }
      InitializeWithPolicy();
    }
    else {
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                (aLStack_70,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/arena.cc"
                 ,0x272);
      absl::lts_20240722::log_internal::LogMessage::operator<<
                ((LogMessage *)aLStack_70,(char (*) [39])"MaybeAllocateAligned cannot fail here.");
    }
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(aLStack_70);
  }
  if (size < 0x30 || buf == (void *)0x0) {
    local_48.start_block_size = policy->start_block_size;
    local_48.max_block_size = policy->max_block_size;
    local_48.block_alloc = policy->block_alloc;
    local_48.block_dealloc = policy->block_dealloc;
    size_00 = 0x30;
    if (0x30 < local_48.start_block_size) {
      size_00 = local_48.start_block_size;
    }
    pAStack_50 = (AllocationPolicy *)0x1c42f6;
    SVar13 = anon_unknown_12::AllocateMemory(&local_48,size_00);
  }
  else {
    *(byte *)&(this->alloc_policy_).policy_ = (byte)(this->alloc_policy_).policy_ | 1;
  }
  pAStack_50 = (AllocationPolicy *)0x1c4311;
  ArenaBlock::ArenaBlock((ArenaBlock *)SVar13.p,(ArenaBlock *)0x0,SVar13.n);
  return (ArenaBlock *)SVar13.p;
}

Assistant:

ArenaBlock* ThreadSafeArena::FirstBlock(void* buf, size_t size,
                                        const AllocationPolicy& policy) {
  if (policy.IsDefault()) return FirstBlock(buf, size);

  ABSL_DCHECK_EQ(reinterpret_cast<uintptr_t>(buf) & 7, 0u);

  SizedPtr mem;
  if (buf == nullptr || size < kBlockHeaderSize + kAllocPolicySize) {
    mem = AllocateBlock(&policy, 0, kAllocPolicySize);
  } else {
    mem = {buf, size};
    // Record user-owned block.
    alloc_policy_.set_is_user_owned_initial_block(true);
  }

  return new (mem.p) ArenaBlock{nullptr, mem.n};
}